

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O1

uint32_t phf_f<std::__cxx11::string>
                   (uint32_t d,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k,
                   uint32_t seed)

{
  pointer pcVar1;
  uint uVar2;
  uint *puVar3;
  uint uVar4;
  uint uVar5;
  uint *local_40;
  long local_38;
  uint local_30 [4];
  
  uVar2 = (d * -0x3361d2af >> 0x11 | d * 0x16a88000) * 0x1b873593 ^ seed;
  uVar2 = uVar2 << 0xd | uVar2 >> 0x13;
  pcVar1 = (k->_M_dataplus)._M_p;
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char*>((string *)&local_40,pcVar1,pcVar1 + k->_M_string_length)
  ;
  puVar3 = local_40;
  do {
    uVar2 = uVar2 * 5 + 0xe6546b64;
    uVar5 = 0;
    uVar4 = 0;
    switch(local_38) {
    case 3:
      uVar4 = (uint)*(byte *)((long)puVar3 + 2) << 8;
    case 2:
      uVar5 = uVar4 | (uint)*(byte *)((long)puVar3 + 1) << 0x10;
    case 1:
      uVar2 = (((uint)(byte)*puVar3 << 0x18 | uVar5) * -0x3361d2af >> 0x11 | uVar5 * 0x16a88000) *
              0x1b873593 ^ uVar2;
      uVar2 = (uVar2 << 0xd | uVar2 >> 0x13) * 5 + 0xe6546b64;
    case 0:
      if (local_40 != local_30) {
        operator_delete(local_40);
      }
      uVar2 = (uVar2 >> 0x10 ^ uVar2) * -0x7a143595;
      uVar2 = (uVar2 >> 0xd ^ uVar2) * -0x3d4d51cb;
      return uVar2 >> 0x10 ^ uVar2;
    default:
      uVar4 = *puVar3;
      uVar5 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8;
      uVar2 = ((uVar5 | uVar4 << 0x18) * -0x3361d2af >> 0x11 | uVar5 * 0x16a88000) * 0x1b873593 ^
              uVar2;
      uVar2 = uVar2 << 0xd | uVar2 >> 0x13;
      puVar3 = puVar3 + 1;
      local_38 = local_38 + -4;
    }
  } while( true );
}

Assistant:

static inline uint32_t phf_f(uint32_t d, T k, uint32_t seed) {
	uint32_t h1 = seed;

	h1 = phf_round32(d, h1);
	h1 = phf_round32(k, h1);

	return phf_mix32(h1);
}